

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_printers.hpp
# Opt level: O1

void iutest::detail::
     iuUniversalPrinter<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
     ::Print(basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> *value,
            iu_ostream *os)

{
  string local_30;
  
  ShowAnyCString<char16_t>(&local_30,(value->_M_dataplus)._M_p);
  iuUniversalPrinter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::Print(&local_30,os);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

static void Print(const T& value, iu_ostream* os)
    {
        UniversalPrintTo(value, os);
    }